

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryTypeHandler.cpp
# Opt level: O3

void __thiscall
Js::DictionaryTypeHandlerBase<unsigned_short>::SetPropertyWithDescriptor<true>
          (DictionaryTypeHandlerBase<unsigned_short> *this,DynamicObject *instance,
          PropertyRecord *propertyRecord,DictionaryPropertyDescriptor<unsigned_short> **pdescriptor,
          Var value,PropertyOperationFlags flags,PropertyValueInfo *info)

{
  Type *pTVar1;
  PropertyAttributes PVar2;
  byte bVar3;
  RecyclerWeakReference<Js::DynamicObject> *pRVar4;
  ScriptContext *scriptContext;
  JavascriptLibrary *pJVar5;
  code *pcVar6;
  uint propertyId;
  bool bVar7;
  bool bVar8;
  Flags FVar9;
  unsigned_short uVar10;
  BOOL BVar11;
  undefined4 *puVar12;
  UndeclaredBlockVariable *pUVar13;
  Var aValue;
  RecyclableObject *function;
  Flags FVar14;
  PropertyOperationFlags index;
  DictionaryPropertyDescriptor<unsigned_short> *pDVar15;
  Var pvVar16;
  PropertyRecord *local_60;
  PropertyRecord *propertyRecord_local;
  int i;
  Var local_48;
  DictionaryTypeHandlerBase<unsigned_short> *local_40;
  uint local_38;
  PropertyOperationFlags local_34;
  
  local_60 = propertyRecord;
  local_40 = this;
  local_34 = flags;
  if ((pdescriptor == (DictionaryPropertyDescriptor<unsigned_short> **)0x0) ||
     (pDVar15 = *pdescriptor, pDVar15 == (DictionaryPropertyDescriptor<unsigned_short> *)0x0)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar12 = 1;
    bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x2e3,"(pdescriptor && *pdescriptor)","pdescriptor && *pdescriptor"
                               );
    if (!bVar7) goto LAB_00da158d;
    *puVar12 = 0;
    pDVar15 = *pdescriptor;
  }
  local_38 = propertyRecord->pid;
  bVar7 = instance == (DynamicObject *)0x0;
  local_48 = value;
  if (bVar7) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar12 = 1;
    bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x2e6,"(instance)","instance");
    if (!bVar8) goto LAB_00da158d;
    *puVar12 = 0;
  }
  if (((pDVar15->Attributes & 8) != 0) && ((pDVar15->flags & IsShadowed) == None)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar12 = 1;
    bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x2e7,
                                "((descriptor->Attributes & 0x08) == 0 || (allowLetConstGlobal && descriptor->GetIsShadowed()))"
                                ,
                                "(descriptor->Attributes & PropertyDeleted) == 0 || (allowLetConstGlobal && descriptor->GetIsShadowed())"
                               );
    if (!bVar8) goto LAB_00da158d;
    *puVar12 = 0;
  }
  if (((local_40->super_DynamicTypeHandler).flags & 0x18) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar12 = 1;
    bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x2ea,"(!GetIsOrMayBecomeShared())","!GetIsOrMayBecomeShared()");
    if (!bVar8) goto LAB_00da158d;
    *puVar12 = 0;
  }
  pRVar4 = (local_40->singletonInstance).ptr;
  if (pRVar4 != (RecyclerWeakReference<Js::DynamicObject> *)0x0) {
    if ((DynamicObject *)(pRVar4->super_RecyclerWeakReferenceBase).strongRef == instance) {
      bVar7 = true;
    }
    else {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar12 = 1;
      bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                  ,0x2ed,
                                  "(this->singletonInstance == nullptr || localSingletonInstance == instance)"
                                  ,
                                  "this->singletonInstance == nullptr || localSingletonInstance == instance"
                                 );
      if (!bVar7) goto LAB_00da158d;
      *puVar12 = 0;
      bVar7 = false;
    }
  }
  uVar10 = DictionaryPropertyDescriptor<unsigned_short>::GetDataPropertyIndex<true>(pDVar15);
  if (uVar10 == 0xffff) {
    uVar10 = DictionaryPropertyDescriptor<unsigned_short>::GetSetterPropertyIndex(pDVar15);
    pvVar16 = local_48;
    if (uVar10 != 0xffff) {
      uVar10 = DictionaryPropertyDescriptor<unsigned_short>::GetSetterPropertyIndex(pDVar15);
      aValue = DynamicObject::GetSlot(instance,(uint)uVar10);
      function = VarTo<Js::RecyclableObject>(aValue);
      JavascriptOperators::CallSetter(function,instance,pvVar16,(ScriptContext *)0x0);
      bVar7 = JsUtil::
              BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
              ::TryGetReference<Js::PropertyRecord_const*>
                        ((BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                          *)(local_40->propertyMap).ptr,&local_60,pdescriptor,
                         (int *)&propertyRecord_local);
      if (bVar7) {
        pDVar15 = *pdescriptor;
        uVar10 = DictionaryPropertyDescriptor<unsigned_short>::GetDataPropertyIndex<false>(pDVar15);
        if (uVar10 == 0xffff) {
          uVar10 = DictionaryPropertyDescriptor<unsigned_short>::GetSetterPropertyIndex(pDVar15);
          if ((uVar10 != 0xffff) &&
             (uVar10 = DictionaryPropertyDescriptor<unsigned_short>::GetSetterPropertyIndex(pDVar15)
             , info != (PropertyValueInfo *)0x0)) {
            PVar2 = pDVar15->Attributes;
            info->m_instance = &instance->super_RecyclableObject;
            info->m_propertyIndex = uVar10;
            info->m_attributes = PVar2;
            info->flags = InlineCacheSetterFlag;
          }
        }
        else if (info != (PropertyValueInfo *)0x0) {
          PVar2 = pDVar15->Attributes;
          info->m_instance = &instance->super_RecyclableObject;
          info->m_propertyIndex = uVar10;
          info->m_attributes = PVar2;
          info->flags = InlineCacheNoFlags;
        }
      }
      else {
        *pdescriptor = (DictionaryPropertyDescriptor<unsigned_short> *)0x0;
      }
    }
    goto LAB_00da1486;
  }
  if ((-1 < (char)(undefined1)local_34) && (0x3f < pDVar15->Attributes)) {
    scriptContext =
         (((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
         super_JavascriptLibraryBase).scriptContext.ptr;
    _i = pDVar15;
    pUVar13 = (UndeclaredBlockVariable *)DynamicObject::GetSlot(instance,(uint)uVar10);
    pDVar15 = _i;
    if ((((scriptContext->super_ScriptContextBase).javascriptLibrary)->undeclBlockVarSentinel).ptr
        == pUVar13) {
      JavascriptError::ThrowReferenceError(scriptContext,-0x7ff5ec07,(PCWSTR)0x0);
    }
  }
  pvVar16 = local_48;
  index = (PropertyOperationFlags)uVar10;
  if ((pDVar15->flags & IsInitialized) == None) {
    if ((((local_34 & PropertyOperation_PreInit) == PropertyOperation_None) &&
        (pDVar15->flags = pDVar15->flags | IsInitialized, bVar7)) &&
       ((local_34 & (PropertyOperation_NonFixedValue|PropertyOperation_SpecialValue)) ==
        PropertyOperation_None && 0xf < local_38)) {
      local_34 = index;
      if (local_48 == (Var)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar12 = 1;
        bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                    ,0x305,"(value != nullptr)","value != nullptr");
        if (!bVar7) goto LAB_00da158d;
        *puVar12 = 0;
      }
      BVar11 = RecyclableObject::IsExternal(&instance->super_RecyclableObject);
      if (BVar11 != 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar12 = 1;
        bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                    ,0x307,"(!instance->IsExternal())","!instance->IsExternal()");
        if (!bVar7) {
LAB_00da158d:
          pcVar6 = (code *)invalidInstructionException();
          (*pcVar6)();
        }
        *puVar12 = 0;
      }
      bVar7 = VarIs<Js::JavascriptFunction>(pvVar16);
      if (bVar7) {
        bVar7 = Phases::IsEnabled((Phases *)&DAT_015a4e90,FixMethodPropsPhase);
        FVar14 = pDVar15->flags & ~IsFixed;
        if (bVar7) goto LAB_00da157d;
LAB_00da1576:
        FVar9 = IsFixed;
      }
      else {
        bVar7 = Phases::IsEnabled((Phases *)&DAT_015a4e90,FixDataPropsPhase);
        if (bVar7) {
          FVar14 = pDVar15->flags & ~IsFixed;
        }
        else {
          bVar7 = DynamicTypeHandler::CheckHeuristicsForFixedDataProps(instance,local_38,pvVar16);
          FVar14 = pDVar15->flags & ~IsFixed;
          if (bVar7) goto LAB_00da1576;
        }
LAB_00da157d:
        FVar9 = None;
      }
      pDVar15->flags = FVar14 | FVar9;
      index = local_34;
    }
  }
  else {
    InvalidateFixedField<int>(local_40,instance,local_38,pDVar15);
  }
  pvVar16 = local_48;
  DynamicTypeHandler::SetSlotUnchecked(instance,index,local_48);
  if ((pDVar15->flags & (IsFixed|IsInitialized)) == IsInitialized) {
    if (info != (PropertyValueInfo *)0x0) {
      bVar3 = pDVar15->Attributes;
      info->m_instance = &instance->super_RecyclableObject;
      info->m_propertyIndex = uVar10;
      info->m_attributes = bVar3 >> 2 & 4 | bVar3;
      info->flags = InlineCacheNoFlags;
    }
  }
  else if (info != (PropertyValueInfo *)0x0) {
    info->m_instance = &instance->super_RecyclableObject;
    info->m_propertyIndex = 0xffff;
    info->m_attributes = '\0';
    info->flags = InlineCacheNoFlags;
  }
LAB_00da1486:
  propertyId = local_38;
  bVar7 = NoSpecialPropertyCache::IsDefaultHandledSpecialProperty(local_38);
  if ((bVar7) &&
     (pTVar1 = &(local_40->super_DynamicTypeHandler).propertyTypes, *pTVar1 = *pTVar1 | 0x80,
     ((local_40->super_DynamicTypeHandler).flags & 0x20) != 0)) {
    pJVar5 = (((((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
               super_JavascriptLibraryBase).scriptContext.ptr)->super_ScriptContextBase).
             javascriptLibrary;
    Memory::Recycler::WBSetBit((char *)&propertyRecord_local);
    pvVar16 = local_48;
    propertyRecord_local = (PropertyRecord *)&pJVar5->typesWithNoSpecialPropertyProtoChain;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&propertyRecord_local);
    PrototypeChainCache<Js::NoSpecialPropertyCache>::Clear
              ((PrototypeChainCache<Js::NoSpecialPropertyCache> *)propertyRecord_local);
  }
  DynamicTypeHandler::SetPropertyUpdateSideEffect
            (&local_40->super_DynamicTypeHandler,instance,propertyId,pvVar16,SideEffects_Any);
  return;
}

Assistant:

void DictionaryTypeHandlerBase<T>::SetPropertyWithDescriptor(
        _In_ DynamicObject* instance,
        _In_ PropertyRecord const* propertyRecord,
        _Inout_ DictionaryPropertyDescriptor<T> ** pdescriptor,
        _In_ Var value,
        _In_ PropertyOperationFlags flags,
        _Inout_opt_ PropertyValueInfo* info)
    {
        Assert(pdescriptor && *pdescriptor);
        DictionaryPropertyDescriptor<T> * descriptor = *pdescriptor;
        PropertyId propertyId = propertyRecord->GetPropertyId();
        Assert(instance);
        Assert((descriptor->Attributes & PropertyDeleted) == 0 || (allowLetConstGlobal && descriptor->GetIsShadowed()));

        // DictionaryTypeHandlers are not supposed to be shared.
        Assert(!GetIsOrMayBecomeShared());
#if ENABLE_FIXED_FIELDS
        DynamicObject* localSingletonInstance = this->singletonInstance != nullptr ? this->singletonInstance->Get() : nullptr;
        Assert(this->singletonInstance == nullptr || localSingletonInstance == instance);
#endif
        T dataSlotAllowLetConstGlobal = descriptor->template GetDataPropertyIndex<allowLetConstGlobal>();
        if (dataSlotAllowLetConstGlobal != NoSlots)
        {
            if (allowLetConstGlobal
                && (descriptor->Attributes & PropertyNoRedecl)
                && !(flags & PropertyOperation_AllowUndecl))
            {
                ScriptContext* scriptContext = instance->GetScriptContext();
                if (scriptContext->IsUndeclBlockVar(instance->GetSlot(dataSlotAllowLetConstGlobal)))
                {
                    JavascriptError::ThrowReferenceError(scriptContext, JSERR_UseBeforeDeclaration);
                }
            }
#if ENABLE_FIXED_FIELDS
            if (!descriptor->GetIsInitialized())
            {
                if ((flags & PropertyOperation_PreInit) == 0)
                {
                    descriptor->SetIsInitialized(true);
                    if (localSingletonInstance == instance && !IsInternalPropertyId(propertyId) &&
                        (flags & (PropertyOperation_NonFixedValue | PropertyOperation_SpecialValue)) == 0)
                    {
                        Assert(value != nullptr);
                        // We don't want fixed properties on external objects.  See DynamicObject::ResetObject for more information.
                        Assert(!instance->IsExternal());
                        descriptor->SetIsFixed(VarIs<JavascriptFunction>(value) ? ShouldFixMethodProperties() : (ShouldFixDataProperties() && CheckHeuristicsForFixedDataProps(instance, propertyId, value)));
                    }
                }
            }
            else
            {
                InvalidateFixedField(instance, propertyId, descriptor);
            }
#endif
            SetSlotUnchecked(instance, dataSlotAllowLetConstGlobal, value);
            // If we just added a fixed method, don't populate the inline cache so that we always take the slow path
            // when overwriting this property and correctly invalidate any JIT-ed code that hard-coded this method.
            if (!descriptor->IsOrMayBecomeFixed())
            {
                SetPropertyValueInfoNonFixed(info, instance, dataSlotAllowLetConstGlobal, GetLetConstGlobalPropertyAttributes<allowLetConstGlobal>(descriptor->Attributes));
            }
            else
            {
                PropertyValueInfo::SetNoCache(info, instance);
            }
        }
        else if (descriptor->GetSetterPropertyIndex() != NoSlots)
        {
            RecyclableObject* func = VarTo<RecyclableObject>(instance->GetSlot(descriptor->GetSetterPropertyIndex()));
            JavascriptOperators::CallSetter(func, instance, value, NULL);

            // Wait for the setter to return before setting up the inline cache info, as the setter may change
            // the attributes

            if (propertyMap->TryGetReference(propertyRecord, pdescriptor))
            {
                descriptor = *pdescriptor;
                T dataSlot = descriptor->template GetDataPropertyIndex<false>();
                if (dataSlot != NoSlots)
                {
                    SetPropertyValueInfoNonFixed(info, instance, dataSlot, descriptor->Attributes);
                }
                else if (descriptor->GetSetterPropertyIndex() != NoSlots)
                {
                    SetPropertyValueInfoNonFixed(info, instance, descriptor->GetSetterPropertyIndex(), descriptor->Attributes, InlineCacheSetterFlag);
                }
            }
            else
            {
                *pdescriptor = nullptr;
            }
        }
        if (NoSpecialPropertyCache::IsDefaultHandledSpecialProperty(propertyId))
        {
            this->SetHasSpecialProperties();
            if (GetFlags() & IsPrototypeFlag)
            {
                instance->GetScriptContext()->GetLibrary()->GetTypesWithNoSpecialPropertyProtoChainCache()->Clear();
            }
        }
        SetPropertyUpdateSideEffect(instance, propertyId, value, SideEffects_Any);
    }